

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

string_view __thiscall absl::lts_20250127::Cord::InlineRep::FindFlatStartPiece(InlineRep *this)

{
  size_type __len;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordRep *this_00;
  CordRepSubstring *pCVar4;
  CordRepFlat *pCVar5;
  CordRepExternal *pCVar6;
  size_t length;
  size_t offset;
  CordRepBtree *pCStack_30;
  int height;
  CordRepBtree *tree;
  CordRep *node;
  InlineRep *this_local;
  
  bVar1 = is_tree(this);
  if (bVar1) {
    rep = InlineRep::tree(this);
    tree = (CordRepBtree *)cord_internal::SkipCrcNode(rep);
    bVar1 = cord_internal::CordRep::IsFlat((CordRep *)tree);
    if (bVar1) {
      pCVar5 = cord_internal::CordRep::flat((CordRep *)tree);
      pcVar2 = cord_internal::CordRepFlat::Data(pCVar5);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,pcVar2,
                 (tree->super_CordRep).length);
    }
    else {
      bVar1 = cord_internal::CordRep::IsExternal((CordRep *)tree);
      if (bVar1) {
        pCVar6 = cord_internal::CordRep::external((CordRep *)tree);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,pCVar6->base,
                   (tree->super_CordRep).length);
      }
      else {
        bVar1 = cord_internal::CordRep::IsBtree((CordRep *)tree);
        if (bVar1) {
          pCStack_30 = cord_internal::CordRep::btree((CordRep *)tree);
          offset._4_4_ = cord_internal::CordRepBtree::height(pCStack_30);
          while (offset._4_4_ = offset._4_4_ + -1, -1 < offset._4_4_) {
            this_00 = cord_internal::CordRepBtree::Edge(pCStack_30,kFront);
            pCStack_30 = cord_internal::CordRep::btree(this_00);
          }
          sVar3 = cord_internal::CordRepBtree::begin(pCStack_30);
          _this_local = cord_internal::CordRepBtree::Data(pCStack_30,sVar3);
        }
        else {
          length = 0;
          __len = (tree->super_CordRep).length;
          if (__len == 0) {
            __assert_fail("length != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                          ,0x34b,
                          "absl::string_view absl::Cord::InlineRep::FindFlatStartPiece() const");
          }
          bVar1 = cord_internal::CordRep::IsSubstring((CordRep *)tree);
          if (bVar1) {
            pCVar4 = cord_internal::CordRep::substring((CordRep *)tree);
            length = pCVar4->start;
            pCVar4 = cord_internal::CordRep::substring((CordRep *)tree);
            tree = (CordRepBtree *)pCVar4->child;
          }
          bVar1 = cord_internal::CordRep::IsFlat(&tree->super_CordRep);
          if (bVar1) {
            pCVar5 = cord_internal::CordRep::flat(&tree->super_CordRep);
            pcVar2 = cord_internal::CordRepFlat::Data(pCVar5);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                       pcVar2 + length,__len);
          }
          else {
            bVar1 = cord_internal::CordRep::IsExternal(&tree->super_CordRep);
            if (!bVar1) {
              __assert_fail("node->IsExternal() && \"Expect FLAT or EXTERNAL node here\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                            ,0x356,
                            "absl::string_view absl::Cord::InlineRep::FindFlatStartPiece() const");
            }
            pCVar6 = cord_internal::CordRep::external(&tree->super_CordRep);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                       pCVar6->base + length,__len);
          }
        }
      }
    }
  }
  else {
    pcVar2 = cord_internal::InlineData::as_chars(&this->data_);
    sVar3 = cord_internal::InlineData::inline_size(&this->data_);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,pcVar2,sVar3);
  }
  return _this_local;
}

Assistant:

inline absl::string_view Cord::InlineRep::FindFlatStartPiece() const {
  if (!is_tree()) {
    return absl::string_view(data_.as_chars(), data_.inline_size());
  }

  CordRep* node = cord_internal::SkipCrcNode(tree());
  if (node->IsFlat()) {
    return absl::string_view(node->flat()->Data(), node->length);
  }

  if (node->IsExternal()) {
    return absl::string_view(node->external()->base, node->length);
  }

  if (node->IsBtree()) {
    CordRepBtree* tree = node->btree();
    int height = tree->height();
    while (--height >= 0) {
      tree = tree->Edge(CordRepBtree::kFront)->btree();
    }
    return tree->Data(tree->begin());
  }

  // Get the child node if we encounter a SUBSTRING.
  size_t offset = 0;
  size_t length = node->length;
  assert(length != 0);

  if (node->IsSubstring()) {
    offset = node->substring()->start;
    node = node->substring()->child;
  }

  if (node->IsFlat()) {
    return absl::string_view(node->flat()->Data() + offset, length);
  }

  assert(node->IsExternal() && "Expect FLAT or EXTERNAL node here");

  return absl::string_view(node->external()->base + offset, length);
}